

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void EmitNew(ParseNode *pnode,ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo)

{
  ParseNode *pnode_00;
  code *pcVar1;
  byte bVar2;
  OpCode OVar3;
  FuncInfo *pFVar4;
  FuncInfo *byteCodeGenerator_00;
  bool bVar5;
  ProfileId PVar6;
  ProfileId PVar7;
  ArgSlot AVar8;
  RegSlot RVar9;
  uint32 uVar10;
  ParseNodeCall *pPVar11;
  undefined4 *puVar12;
  ByteCodeWriter *pBVar13;
  bool local_a1;
  bool local_99;
  bool local_75;
  uint spreadIndicesSize;
  uint spreadExtraAlloc;
  bool emitArgOutsAtEnd;
  AuxArray<unsigned_int> *spreadIndices;
  ProfileId local_58;
  OpCode local_56;
  uint uStack_54;
  bool emitProfiledArgouts;
  ProfileId callSiteId_1;
  OpCode op_1;
  uint32 actualArgCount;
  ProfileId callSiteId;
  OpCode op;
  uint tmpCount;
  BOOL fSideEffectArgs;
  ArgSlot argCount;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  ParseNode *pnode_local;
  
  _fSideEffectArgs = funcInfo;
  funcInfo_local = (FuncInfo *)byteCodeGenerator;
  byteCodeGenerator_local = (ByteCodeGenerator *)pnode;
  pPVar11 = ParseNode::AsParseNodeCall(pnode);
  tmpCount._2_2_ = pPVar11->argCount + 1;
  _callSiteId = 0;
  pPVar11 = ParseNode::AsParseNodeCall((ParseNode *)byteCodeGenerator_local);
  actualArgCount = CountArguments(pPVar11->pnodeArgs,(BOOL *)&callSiteId);
  if (tmpCount._2_2_ != actualArgCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x20d1,"(argCount == tmpCount)",
                       "argCount cannot overflow as max args capped at parser level");
    if (!bVar5) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 0;
  }
  ByteCodeGenerator::StartStatement
            ((ByteCodeGenerator *)funcInfo_local,(ParseNode *)byteCodeGenerator_local);
  FuncInfo::StartRecordingOutArgs(_fSideEffectArgs,(uint)tmpCount._2_2_);
  if (_callSiteId != 0) {
    pPVar11 = ParseNode::AsParseNodeCall((ParseNode *)byteCodeGenerator_local);
    SaveOpndValue(pPVar11->pnodeTarget,_fSideEffectArgs);
  }
  pPVar11 = ParseNode::AsParseNodeCall((ParseNode *)byteCodeGenerator_local);
  Emit(pPVar11->pnodeTarget,(ByteCodeGenerator *)funcInfo_local,_fSideEffectArgs,0,true,false);
  pPVar11 = ParseNode::AsParseNodeCall((ParseNode *)byteCodeGenerator_local);
  pFVar4 = _fSideEffectArgs;
  if (pPVar11->pnodeArgs == (ParseNodePtr)0x0) {
    pPVar11 = ParseNode::AsParseNodeCall((ParseNode *)byteCodeGenerator_local);
    FuncInfo::ReleaseLoc(pFVar4,pPVar11->pnodeTarget);
    bVar5 = CreateNativeArrays((ByteCodeGenerator *)funcInfo_local,_fSideEffectArgs);
    local_75 = false;
    if (bVar5) {
      pPVar11 = ParseNode::AsParseNodeCall((ParseNode *)byteCodeGenerator_local);
      local_75 = CallTargetIsArray(pPVar11->pnodeTarget);
    }
    op_1 = NewScObject;
    if (local_75 != false) {
      op_1 = NewScObjArray;
    }
    if (tmpCount._2_2_ != 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar12 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x20e7,"(argCount == 1)","argCount == 1");
      if (!bVar5) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar12 = 0;
    }
    callSiteId_1 = ByteCodeGenerator::GetNextCallSiteId((ByteCodeGenerator *)funcInfo_local,op_1);
    pBVar13 = ByteCodeGenerator::Writer((ByteCodeGenerator *)funcInfo_local);
    Js::ByteCodeWriter::StartCall(pBVar13,StartCall,tmpCount._2_2_);
    pBVar13 = ByteCodeGenerator::Writer((ByteCodeGenerator *)funcInfo_local);
    OVar3 = op_1;
    RVar9 = FuncInfo::AcquireLoc(_fSideEffectArgs,(ParseNode *)byteCodeGenerator_local);
    pPVar11 = ParseNode::AsParseNodeCall((ParseNode *)byteCodeGenerator_local);
    Js::ByteCodeWriter::CallI
              (pBVar13,OVar3,RVar9,pPVar11->pnodeTarget->location,tmpCount._2_2_,callSiteId_1,
               CallFlags_None);
    goto LAB_00b4c0d3;
  }
  uStack_54 = 0;
  bVar5 = IsCallOfConstants((ParseNode *)byteCodeGenerator_local);
  if (bVar5) {
    pBVar13 = ByteCodeGenerator::Writer((ByteCodeGenerator *)funcInfo_local);
    Js::ByteCodeWriter::StartCall(pBVar13,StartCall,tmpCount._2_2_);
    pFVar4 = _fSideEffectArgs;
    pPVar11 = ParseNode::AsParseNodeCall((ParseNode *)byteCodeGenerator_local);
    FuncInfo::ReleaseLoc(pFVar4,pPVar11->pnodeTarget);
    AVar8 = EmitNewObjectOfConstants
                      ((ParseNode *)byteCodeGenerator_local,(ByteCodeGenerator *)funcInfo_local,
                       _fSideEffectArgs,(uint)tmpCount._2_2_);
    uStack_54 = (uint)AVar8;
  }
  else {
    bVar5 = CreateNativeArrays((ByteCodeGenerator *)funcInfo_local,_fSideEffectArgs);
    if (bVar5) {
      pPVar11 = ParseNode::AsParseNodeCall((ParseNode *)byteCodeGenerator_local);
      bVar5 = CallTargetIsArray(pPVar11->pnodeTarget);
      if (!bVar5) goto LAB_00b4bd01;
      pPVar11 = ParseNode::AsParseNodeCall((ParseNode *)byteCodeGenerator_local);
      local_56 = NewScObjArray;
      if (pPVar11->spreadArgCount != 0) {
        local_56 = NewScObjArraySpread;
      }
    }
    else {
LAB_00b4bd01:
      pPVar11 = ParseNode::AsParseNodeCall((ParseNode *)byteCodeGenerator_local);
      local_56 = NewScObject;
      if (pPVar11->spreadArgCount != 0) {
        local_56 = NewScObjectSpread;
      }
    }
    PVar6 = ByteCodeGenerator::GetNextCallSiteId((ByteCodeGenerator *)funcInfo_local,local_56);
    local_58 = PVar6;
    PVar7 = ByteCodeGenerator::GetCurrentCallSiteId((ByteCodeGenerator *)funcInfo_local);
    spreadIndices._7_1_ = PVar6 != PVar7;
    _spreadExtraAlloc = (AuxArray<unsigned_int> *)0x0;
    pPVar11 = ParseNode::AsParseNodeCall((ParseNode *)byteCodeGenerator_local);
    local_99 = true;
    if (((byte)pPVar11->field_0x24 >> 4 & 1) == 0) {
      bVar5 = Js::FunctionProxy::IsCoroutine
                        (&_fSideEffectArgs->byteCodeFunction->super_FunctionProxy);
      local_a1 = false;
      if (bVar5) {
        pPVar11 = ParseNode::AsParseNodeCall((ParseNode *)byteCodeGenerator_local);
        local_a1 = pPVar11->pnodeArgs != (ParseNodePtr)0x0;
      }
      local_99 = local_a1;
    }
    pPVar11 = ParseNode::AsParseNodeCall((ParseNode *)byteCodeGenerator_local);
    byteCodeGenerator_00 = funcInfo_local;
    pFVar4 = _fSideEffectArgs;
    AVar8 = tmpCount._2_2_;
    PVar6 = local_58;
    bVar2 = spreadIndices._7_1_;
    pnode_00 = pPVar11->pnodeArgs;
    pPVar11 = ParseNode::AsParseNodeCall((ParseNode *)byteCodeGenerator_local);
    AVar8 = EmitArgList(pnode_00,0xffffffff,0xffffffff,0,1,(ByteCodeGenerator *)byteCodeGenerator_00
                        ,pFVar4,PVar6,AVar8,local_99,(bool)(bVar2 & 1),pPVar11->spreadArgCount,
                        (AuxArray<unsigned_int> **)&spreadExtraAlloc);
    pFVar4 = _fSideEffectArgs;
    uStack_54 = (uint)AVar8;
    pPVar11 = ParseNode::AsParseNodeCall((ParseNode *)byteCodeGenerator_local);
    FuncInfo::ReleaseLoc(pFVar4,pPVar11->pnodeTarget);
    pPVar11 = ParseNode::AsParseNodeCall((ParseNode *)byteCodeGenerator_local);
    if (pPVar11->spreadArgCount == 0) {
      pBVar13 = ByteCodeGenerator::Writer((ByteCodeGenerator *)funcInfo_local);
      OVar3 = local_56;
      RVar9 = FuncInfo::AcquireLoc(_fSideEffectArgs,(ParseNode *)byteCodeGenerator_local);
      pPVar11 = ParseNode::AsParseNodeCall((ParseNode *)byteCodeGenerator_local);
      Js::ByteCodeWriter::CallI
                (pBVar13,OVar3,RVar9,pPVar11->pnodeTarget->location,(ArgSlot)uStack_54,local_58,
                 CallFlags_None);
    }
    else {
      if (_spreadExtraAlloc == (AuxArray<unsigned_int> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x2114,"(spreadIndices != nullptr)","spreadIndices != nullptr");
        if (!bVar5) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 0;
      }
      uVar10 = UInt32Math::Mul(_spreadExtraAlloc->count,4);
      uVar10 = UInt32Math::Add(4,uVar10);
      pBVar13 = ByteCodeGenerator::Writer((ByteCodeGenerator *)funcInfo_local);
      OVar3 = local_56;
      RVar9 = FuncInfo::AcquireLoc(_fSideEffectArgs,(ParseNode *)byteCodeGenerator_local);
      pPVar11 = ParseNode::AsParseNodeCall((ParseNode *)byteCodeGenerator_local);
      Js::ByteCodeWriter::CallIExtended
                (pBVar13,OVar3,RVar9,pPVar11->pnodeTarget->location,(ArgSlot)uStack_54,
                 CallIExtended_SpreadArgs,_spreadExtraAlloc,uVar10,local_58,CallFlags_None);
    }
  }
  if (tmpCount._2_2_ != uStack_54) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x2122,"(argCount == actualArgCount)","argCount == actualArgCount");
    if (!bVar5) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 0;
  }
LAB_00b4c0d3:
  FuncInfo::EndRecordingOutArgs(_fSideEffectArgs,tmpCount._2_2_);
  return;
}

Assistant:

void EmitNew(ParseNode* pnode, ByteCodeGenerator* byteCodeGenerator, FuncInfo* funcInfo)
{
    Js::ArgSlot argCount = pnode->AsParseNodeCall()->argCount;
    argCount++; // include "this"

    BOOL fSideEffectArgs = FALSE;
    unsigned int tmpCount = CountArguments(pnode->AsParseNodeCall()->pnodeArgs, &fSideEffectArgs);
    AssertOrFailFastMsg(argCount == tmpCount, "argCount cannot overflow as max args capped at parser level");

    byteCodeGenerator->StartStatement(pnode);

    // Start call, allocate out param space
    funcInfo->StartRecordingOutArgs(argCount);

    // Assign the call target operand(s), putting them into expression temps if necessary to protect
    // them from side-effects.
    if (fSideEffectArgs)
    {
        SaveOpndValue(pnode->AsParseNodeCall()->pnodeTarget, funcInfo);
    }

    Emit(pnode->AsParseNodeCall()->pnodeTarget, byteCodeGenerator, funcInfo, false, true);

    if (pnode->AsParseNodeCall()->pnodeArgs == nullptr)
    {
        funcInfo->ReleaseLoc(pnode->AsParseNodeCall()->pnodeTarget);
        Js::OpCode op = (CreateNativeArrays(byteCodeGenerator, funcInfo)
            && CallTargetIsArray(pnode->AsParseNodeCall()->pnodeTarget))
            ? Js::OpCode::NewScObjArray : Js::OpCode::NewScObject;
        Assert(argCount == 1);

        Js::ProfileId callSiteId = byteCodeGenerator->GetNextCallSiteId(op);
        byteCodeGenerator->Writer()->StartCall(Js::OpCode::StartCall, argCount);
        byteCodeGenerator->Writer()->CallI(op, funcInfo->AcquireLoc(pnode),
            pnode->AsParseNodeCall()->pnodeTarget->location, argCount, callSiteId);
    }
    else
    {
        uint32 actualArgCount = 0;

        if (IsCallOfConstants(pnode))
        {
            byteCodeGenerator->Writer()->StartCall(Js::OpCode::StartCall, argCount);
            funcInfo->ReleaseLoc(pnode->AsParseNodeCall()->pnodeTarget);
            actualArgCount = EmitNewObjectOfConstants(pnode, byteCodeGenerator, funcInfo, argCount);
        }
        else
        {
            Js::OpCode op;
            if ((CreateNativeArrays(byteCodeGenerator, funcInfo) && CallTargetIsArray(pnode->AsParseNodeCall()->pnodeTarget)))
            {
                op = pnode->AsParseNodeCall()->spreadArgCount > 0 ? Js::OpCode::NewScObjArraySpread : Js::OpCode::NewScObjArray;
            }
            else
            {
                op = pnode->AsParseNodeCall()->spreadArgCount > 0 ? Js::OpCode::NewScObjectSpread : Js::OpCode::NewScObject;
            }

            Js::ProfileId callSiteId = byteCodeGenerator->GetNextCallSiteId(op);

            // Only emit profiled argouts if we're going to profile this call.
            bool emitProfiledArgouts = callSiteId != byteCodeGenerator->GetCurrentCallSiteId();

            Js::AuxArray<uint32> *spreadIndices = nullptr;

            // Emit argouts at end for generators so that we don't need to restore them when bailing in
            bool emitArgOutsAtEnd = pnode->AsParseNodeCall()->hasDestructuring || (funcInfo->byteCodeFunction->IsCoroutine() && pnode->AsParseNodeCall()->pnodeArgs != nullptr);
            actualArgCount = EmitArgList(pnode->AsParseNodeCall()->pnodeArgs, Js::Constants::NoRegister, Js::Constants::NoRegister,
                false, true, byteCodeGenerator, funcInfo, callSiteId, argCount, emitArgOutsAtEnd, emitProfiledArgouts, pnode->AsParseNodeCall()->spreadArgCount, &spreadIndices);

            funcInfo->ReleaseLoc(pnode->AsParseNodeCall()->pnodeTarget);

            if (pnode->AsParseNodeCall()->spreadArgCount > 0)
            {
                Assert(spreadIndices != nullptr);
                uint spreadExtraAlloc = UInt32Math::Mul(spreadIndices->count, sizeof(uint32));
                uint spreadIndicesSize = UInt32Math::Add(sizeof(*spreadIndices), spreadExtraAlloc);
                byteCodeGenerator->Writer()->CallIExtended(op, funcInfo->AcquireLoc(pnode), pnode->AsParseNodeCall()->pnodeTarget->location,
                    (uint16)actualArgCount, Js::CallIExtended_SpreadArgs,
                    spreadIndices, spreadIndicesSize, callSiteId);
            }
            else
            {
                byteCodeGenerator->Writer()->CallI(op, funcInfo->AcquireLoc(pnode), pnode->AsParseNodeCall()->pnodeTarget->location,
                    (uint16)actualArgCount, callSiteId);
            }
        }

        Assert(argCount == actualArgCount);
    }

    // End call, pop param space
    funcInfo->EndRecordingOutArgs(argCount);
    return;
}